

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void vkt::Draw::createTopologyGroups(TestCaseGroup *testGroup,DrawCommandType cmdType)

{
  char *__s;
  TestCaseParams local_c4;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_81;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string groupName;
  VkPrimitiveTopology local_18;
  VkPrimitiveTopology topology;
  deUint32 idx;
  DrawCommandType cmdType_local;
  TestCaseGroup *testGroup_local;
  
  for (local_18 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; local_18 != VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
      local_18 = local_18 + VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
    groupName.field_2._12_4_ = local_18;
    __s = ::vk::getPrimitiveTopologyName(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
    de::toLower(&local_60,&local_80);
    std::__cxx11::string::substr((ulong)local_40,(ulong)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Testcases with a specific topology.",&local_b9);
    anon_unknown_0::TestCaseParams::TestCaseParams(&local_c4,cmdType,groupName.field_2._12_4_);
    addTestGroup<vkt::Draw::(anonymous_namespace)::TestCaseParams>
              (testGroup,(string *)local_40,&local_b8,populateSubGroup,local_c4);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void createTopologyGroups (tcu::TestCaseGroup* testGroup, const DrawCommandType cmdType)
{
	for (deUint32 idx = 0; idx != vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++idx)
	{
		const vk::VkPrimitiveTopology	topology	= vk::VkPrimitiveTopology(idx);
		const std::string				groupName	= de::toLower(getPrimitiveTopologyName(topology)).substr(22);
		addTestGroup(testGroup, groupName, "Testcases with a specific topology.", populateSubGroup, TestCaseParams(cmdType, topology));
	}
}